

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_editor_for_class(_class *c)

{
  t_symbol *ptVar1;
  
  ptVar1 = gensym("mouse");
  class_addmethod(c,canvas_mouse,ptVar1,A_FLOAT,1,1,1,0);
  ptVar1 = gensym("mouseup");
  class_addmethod(c,canvas_mouseup,ptVar1,A_FLOAT,1,1,0);
  ptVar1 = gensym("key");
  class_addmethod(c,canvas_key,ptVar1,A_GIMME,0);
  ptVar1 = gensym("motion");
  class_addmethod(c,canvas_motion,ptVar1,A_FLOAT,1,1,6,0);
  ptVar1 = gensym("menuclose");
  class_addmethod(c,canvas_menuclose,ptVar1,A_DEFFLOAT,0);
  ptVar1 = gensym("findparent");
  class_addmethod(c,canvas_find_parent,ptVar1,A_NULL);
  return;
}

Assistant:

void canvas_editor_for_class(t_class *c)
{
    class_addmethod(c, (t_method)canvas_mouse, gensym("mouse"),
        A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
    class_addmethod(c, (t_method)canvas_mouseup, gensym("mouseup"),
        A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
    class_addmethod(c, (t_method)canvas_key, gensym("key"),
        A_GIMME, A_NULL);
    class_addmethod(c, (t_method)canvas_motion, gensym("motion"),
        A_FLOAT, A_FLOAT, A_FLOAT, A_DEFFLOAT, A_NULL);

/* ------------------------ menu actions ---------------------------- */
    class_addmethod(c, (t_method)canvas_menuclose,
        gensym("menuclose"), A_DEFFLOAT, 0);
    class_addmethod(c, (t_method)canvas_find_parent,
        gensym("findparent"), A_NULL);
}